

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TArray<FKeySection,_FKeySection>::DoDelete
          (TArray<FKeySection,_FKeySection> *this,uint first,uint last)

{
  long lVar1;
  ulong uVar2;
  
  if (last != 0xffffffff) {
    uVar2 = (ulong)first;
    lVar1 = uVar2 << 5;
    for (; uVar2 <= last; uVar2 = uVar2 + 1) {
      FKeySection::~FKeySection((FKeySection *)((long)&(this->Array->mTitle).Chars + lVar1));
      lVar1 = lVar1 + 0x20;
    }
    return;
  }
  __assert_fail("last != ~0u",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./tarray.h"
                ,0x1b2,
                "void TArray<FKeySection>::DoDelete(unsigned int, unsigned int) [T = FKeySection, TT = FKeySection]"
               );
}

Assistant:

void DoDelete (unsigned int first, unsigned int last)
	{
		assert (last != ~0u);
		for (unsigned int i = first; i <= last; ++i)
		{
			Array[i].~T();
		}
	}